

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void crec_copy(jit_State *J,TRef trdst,TRef trsrc,TRef trlen,CType *ct)

{
  ushort uVar1;
  uint uVar2;
  CTSize CVar3;
  CType *pCVar4;
  IRType IVar5;
  IRType IVar6;
  TRef TVar7;
  TRef TVar8;
  ulong uVar9;
  IRType *pIVar10;
  ushort uVar11;
  TRef *pTVar12;
  uint uVar13;
  CTState *cts;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  CType *ct_00;
  long lVar17;
  long lVar18;
  bool bVar19;
  ulong local_148;
  CRecMemList ml [16];
  
  if ((short)trlen < 0) goto LAB_0012ecb2;
  uVar2 = (J->cur).ir[trlen & 0x7fff].field_1.op12;
  if (uVar2 == 0) {
    return;
  }
  if (0x80 < uVar2) goto LAB_0012ecb2;
  uVar9 = 8;
  IVar6 = IRT_CDATA;
  uVar14 = 0;
  if (ct == (CType *)0x0) {
    bVar19 = false;
LAB_0012ee71:
    uVar13 = 0x1f;
    if ((uint)uVar9 != 0) {
      for (; (uint)uVar9 >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    IVar5 = ((uVar13 ^ 0x1f) * 2 ^ 0x3e) + IRT_U8;
    if (IVar6 != IRT_CDATA) {
      IVar5 = IVar6;
    }
    uVar15 = 0;
    do {
      uVar15 = uVar15 & 0xffffffff;
      pIVar10 = &ml[uVar15].tp;
      while (uVar13 = (int)uVar9 + uVar14, uVar13 <= uVar2) {
        if (0xf < uVar15) goto LAB_0012ecb2;
        ((CRecMemList *)(pIVar10 + -1))->ofs = uVar14;
        *pIVar10 = IVar5;
        uVar15 = uVar15 + 1;
        pIVar10 = pIVar10 + 4;
        uVar14 = uVar13;
      }
      uVar9 = uVar9 >> 1;
      IVar5 = IVar5 - IRT_TRUE;
    } while (uVar14 < uVar2);
  }
  else {
    cts = (CTState *)(ulong)J[-1].bpropcache[9].mode;
    uVar13 = ct->info;
    if ((uVar13 & 0xf0000000) == 0x30000000) {
      IVar5 = crec_ct2irt(cts,(CType *)((long)&cts->tab->info + (ulong)((uVar13 & 0xffff) << 4)));
      bVar19 = IVar5 != IRT_CDATA;
      if (bVar19) {
        uVar9 = (ulong)"\x04\x04\x04\b\x04\x04\x04\x04\x04\b\x04\x04\x04\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                       [IVar5];
        IVar6 = IVar5;
      }
      goto LAB_0012ee71;
    }
    uVar15 = 0;
    bVar19 = false;
    if ((uVar13 >> 0x17 & 1) != 0) goto LAB_0012ee71;
    uVar1 = ct->sib;
    while (uVar11 = uVar1, uVar11 != 0) {
      pCVar4 = cts->tab;
      uVar1 = pCVar4[uVar11].sib;
      uVar2 = pCVar4[uVar11].info >> 0x1c;
      if (uVar2 != 0xb) {
        if (uVar2 != 9) goto LAB_0012ecb2;
        if (pCVar4[uVar11].name.gcptr32 != 0) {
          uVar9 = (ulong)((pCVar4[uVar11].info & 0xffff) << 4);
          uVar2 = *(uint *)((long)&pCVar4->info + uVar9);
          ct_00 = (CType *)((long)&pCVar4->info + uVar9);
          IVar6 = crec_ct2irt(cts,ct_00);
          if ((IVar6 == IRT_CDATA) || (uVar14 = (uint)uVar15, 0xf < uVar14)) goto LAB_0012ecb2;
          CVar3 = pCVar4[uVar11].size;
          ml[uVar15].ofs = CVar3;
          ml[uVar15].tp = IVar6;
          uVar13 = uVar14 + 1;
          uVar15 = (ulong)uVar13;
          if ((uVar2 & 0xf4000000) == 0x34000000) {
            if (uVar14 == 0xf) goto LAB_0012ecb2;
            ml[uVar13].ofs = (ct_00->size >> 1) + CVar3;
            ml[uVar13].tp = IVar6;
            uVar15 = (ulong)(uVar14 + 2);
          }
        }
      }
    }
    bVar19 = true;
  }
  if ((int)uVar15 != 0) {
    lVar17 = 0;
    local_148 = 0;
    do {
      lVar16 = 1;
      pTVar12 = &ml[lVar17].trval;
      lVar18 = 0;
      do {
        if (lVar17 - (uVar15 & 0xffffffff) == lVar18) {
          if (bVar19) {
            return;
          }
          goto LAB_0012ecc5;
        }
        TVar7 = lj_ir_kint64(J,(ulong)((CRecMemList *)(pTVar12 + -3))->ofs);
        (J->fold).ins.field_0.ot = 0x2809;
        (J->fold).ins.field_0.op1 = (IRRef1)trsrc;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
        TVar8 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = (ushort)pTVar12[-2] | 0x4400;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
        (J->fold).ins.field_0.op2 = 0;
        TVar8 = lj_opt_fold(J);
        *pTVar12 = TVar8;
        pTVar12[-1] = TVar7;
        lVar18 = lVar18 + -1;
        if (3 < (uint)lVar16) break;
        uVar9 = lVar16 + lVar17;
        lVar16 = lVar16 + 1;
        pTVar12 = pTVar12 + 4;
      } while (uVar9 < (uVar15 & 0xffffffff));
      local_148 = local_148 & 0xffffffff;
      lVar17 = lVar17 - lVar18;
      pTVar12 = &ml[local_148].trval;
      for (; local_148 <= lVar17 - 1U; local_148 = local_148 + 1) {
        TVar7 = pTVar12[-1];
        (J->fold).ins.field_0.ot = 0x2809;
        (J->fold).ins.field_0.op1 = (IRRef1)trdst;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
        TVar8 = lj_opt_fold(J);
        TVar7 = *pTVar12;
        (J->fold).ins.field_0.ot = (ushort)pTVar12[-2] | 0x4b00;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
        lj_opt_fold(J);
        pTVar12 = pTVar12 + 4;
      }
    } while( true );
  }
LAB_0012ecb2:
  lj_ir_call(J,IRCALL_memcpy,(ulong)trdst,(ulong)trsrc,(ulong)trlen);
LAB_0012ecc5:
  (J->fold).ins.field_0.ot = 0x5400;
  (J->fold).ins.field_1.op12 = 0;
  lj_opt_fold(J);
  return;
}

Assistant:

static void crec_copy(jit_State *J, TRef trdst, TRef trsrc, TRef trlen,
		      CType *ct)
{
  if (tref_isk(trlen)) {  /* Length must be constant. */
    CRecMemList ml[CREC_COPY_MAXUNROLL];
    MSize mlp = 0;
    CTSize step = 1, len = (CTSize)IR(tref_ref(trlen))->i;
    IRType tp = IRT_CDATA;
    int needxbar = 0;
    if (len == 0) return;  /* Shortcut. */
    if (len > CREC_COPY_MAXLEN) goto fallback;
    if (ct) {
      CTState *cts = ctype_ctsG(J2G(J));
      lua_assert(ctype_isarray(ct->info) || ctype_isstruct(ct->info));
      if (ctype_isarray(ct->info)) {
	CType *cct = ctype_rawchild(cts, ct);
	tp = crec_ct2irt(cts, cct);
	if (tp == IRT_CDATA) goto rawcopy;
	step = lj_ir_type_size[tp];
	lua_assert((len & (step-1)) == 0);
      } else if ((ct->info & CTF_UNION)) {
	step = (1u << ctype_align(ct->info));
	goto rawcopy;
      } else {
	mlp = crec_copy_struct(ml, cts, ct);
	goto emitcopy;
      }
    } else {
    rawcopy:
      needxbar = 1;
      if (LJ_TARGET_UNALIGNED || step >= CTSIZE_PTR)
	step = CTSIZE_PTR;
    }
    mlp = crec_copy_unroll(ml, len, step, tp);
  emitcopy:
    if (mlp) {
      crec_copy_emit(J, ml, mlp, trdst, trsrc);
      if (needxbar)
	emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
      return;
    }
  }
fallback:
  /* Call memcpy. Always needs a barrier to disable alias analysis. */
  lj_ir_call(J, IRCALL_memcpy, trdst, trsrc, trlen);
  emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
}